

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_io_extract.hpp
# Opt level: O1

string * file_io::extract_content(string *__return_storage_ptr__,string *__file_path)

{
  long *plVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  istream *piVar7;
  undefined8 extraout_RAX;
  byte bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string _line;
  regex _whitespace;
  ifstream _input_file;
  long *local_318;
  undefined1 local_308 [24];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_2f0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  long local_2d8;
  char local_2d0;
  undefined7 uStack_2cf;
  string *local_2c0;
  string local_2b8;
  string local_298;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_238 [65];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_2c0 = __return_storage_ptr__;
  std::ifstream::ifstream(local_238,(string *)__file_path,_S_in);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Extracting content from: ",0x19);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(__file_path->_M_dataplus)._M_p,
                      __file_path->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 == '\0') {
    std::operator+(&local_258,"Cannot open file at: ",__file_path);
    exit_error_code(3,&local_258);
    if ((pointer)local_308._0_8_ != (pointer)(local_308 + 0x10)) {
      operator_delete((void *)local_308._0_8_,
                      (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_308._16_8_)->first)._M_current + 1));
    }
    if (local_2e0._M_current != &local_2d0) {
      operator_delete(local_2e0._M_current,CONCAT71(uStack_2cf,local_2d0) + 1);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_278);
    std::ifstream::~ifstream(local_238);
    plVar1 = (long *)(local_2c0->_M_dataplus)._M_p;
    if (plVar1 != local_318) {
      operator_delete(plVar1,*local_318 + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            (&local_278,"\\s+",0x10);
  local_2e0._M_current = &local_2d0;
  local_2d8 = 0;
  local_2d0 = '\0';
  bVar8 = 0;
  bVar2 = false;
  bVar5 = false;
  do {
    while( true ) {
      while( true ) {
        cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_2e0,cVar3);
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
          if (local_2e0._M_current != &local_2d0) {
            operator_delete(local_2e0._M_current,CONCAT71(uStack_2cf,local_2d0) + 1);
          }
          std::ifstream::close();
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&local_278);
          std::ifstream::~ifstream(local_238);
          return local_2c0;
        }
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_2e0._M_current,local_2e0._M_current + local_2d8);
        bVar4 = is_frontmatter_tag(&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if ((~bVar4 & 1U) != 0 || bVar8 != 0) break;
        bVar8 = 1;
      }
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,local_2e0._M_current,local_2e0._M_current + local_2d8);
      bVar4 = is_frontmatter_tag(&local_2b8);
      if ((bVar4 & bVar8) == 1) break;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
LAB_001094df:
      if (bVar8 != 1 || bVar2) {
        local_308._16_8_ = (pointer)0x0;
        _Stack_2f0._M_current = (char *)0x0;
        local_308._0_8_ = (pointer)0x0;
        local_308._8_8_ = (pointer)0x0;
        bVar4 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                          (local_2e0,
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(local_2e0._M_current + local_2d8),
                           (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)local_308,&local_278,0);
        if ((pointer)local_308._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_308._0_8_,local_308._16_8_ - local_308._0_8_);
        }
        if (((~bVar4 & local_2d8 != 0) != 0) || (bVar5)) {
          local_308._0_8_ = local_308 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_308,local_2e0._M_current,local_2e0._M_current + local_2d8);
          std::__cxx11::string::append((char *)local_308);
          std::__cxx11::string::_M_append((char *)local_2c0,local_308._0_8_);
          if ((pointer)local_308._0_8_ != (pointer)(local_308 + 0x10)) {
            operator_delete((void *)local_308._0_8_,
                            (ulong)((long)&(((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)local_308._16_8_)->first)._M_current + 1));
          }
          bVar5 = true;
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) goto LAB_001094df;
    bVar2 = true;
  } while( true );
}

Assistant:

std::string extract_content(std::string __file_path) {
        std::string _output;
        std::ifstream _input_file(__file_path);
        std::cout << "Extracting content from: " << __file_path << std::endl;
        if (!_input_file.is_open())
            exit_error_code(3, "Cannot open file at: " + __file_path);		

        std::regex _whitespace("\\s+");
        bool _is_opening_tag_parse = false, _is_closing_tag_parse = false, _content_start = false;
        for (std::string _line; std::getline(_input_file, _line);) {
            if (is_frontmatter_tag(_line) && !_is_opening_tag_parse)
                _is_opening_tag_parse = true;
            else if (is_frontmatter_tag(_line) && _is_opening_tag_parse && !_is_closing_tag_parse)
                _is_closing_tag_parse = true;
            else if ((_is_opening_tag_parse && !_is_closing_tag_parse) || ((regex_match(_line, _whitespace) || _line.empty()) && !_content_start))
                continue;
            else {
                _output += _line + "\n";
                _content_start = true;
            }
        }

        _input_file.close();
        return _output;
    }